

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_boundary_z2_operators<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
                *matrix)

{
  initializer_list<bool> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<bool> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<bool> __l_03;
  initializer_list<bool> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<bool> __l_06;
  initializer_list<unsigned_int> __l_07;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  lazy_ostream *plVar5;
  undefined4 local_984;
  size_t local_980;
  basic_cstring<const_char> local_978;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_968;
  basic_cstring<const_char> local_940;
  basic_cstring<const_char> local_930;
  basic_cstring<const_char> local_920;
  basic_cstring<const_char> local_910;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_900;
  vector<bool,_std::allocator<bool>_> local_8e0;
  assertion_result local_8b8;
  basic_cstring<const_char> local_8a0;
  basic_cstring<const_char> local_890;
  bool local_87f [7];
  iterator local_878;
  undefined8 local_870;
  Field_element local_862;
  allocator<unsigned_int> local_861;
  uint local_860 [4];
  iterator local_850;
  size_type local_848;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_840;
  undefined1 local_828 [8];
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  col4;
  size_t local_7e0;
  basic_cstring<const_char> local_7d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_7c8;
  basic_cstring<const_char> local_7a0;
  basic_cstring<const_char> local_790;
  basic_cstring<const_char> local_780;
  basic_cstring<const_char> local_770;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_760;
  vector<bool,_std::allocator<bool>_> local_740;
  assertion_result local_718;
  basic_cstring<const_char> local_700;
  basic_cstring<const_char> local_6f0;
  bool local_6df [7];
  iterator local_6d8;
  undefined8 local_6d0;
  Field_element local_6c6;
  allocator<unsigned_int> local_6c5;
  uint local_6c4 [3];
  iterator local_6b8;
  size_type local_6b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6a8;
  undefined1 local_690 [8];
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  col3;
  size_t local_648;
  basic_cstring<const_char> local_640;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_630;
  basic_cstring<const_char> local_608;
  basic_cstring<const_char> local_5f8;
  basic_cstring<const_char> local_5e8;
  basic_cstring<const_char> local_5d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5c8;
  vector<bool,_std::allocator<bool>_> local_5a8;
  assertion_result local_580;
  basic_cstring<const_char> local_568;
  basic_cstring<const_char> local_558;
  bool local_547 [7];
  iterator local_540;
  undefined8 local_538;
  Field_element local_529;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_528;
  undefined1 local_508 [8];
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  col2;
  size_t local_4c0;
  basic_cstring<const_char> local_4b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4a8;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  basic_cstring<const_char> local_460;
  basic_cstring<const_char> local_450;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_440;
  vector<bool,_std::allocator<bool>_> local_420;
  assertion_result local_3f8;
  basic_cstring<const_char> local_3e0;
  basic_cstring<const_char> local_3d0;
  bool local_3bf [7];
  iterator local_3b8;
  undefined8 local_3b0;
  Field_element local_3a5;
  undefined4 local_3a4;
  size_t local_3a0;
  basic_cstring<const_char> local_398;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_388;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  vector<bool,_std::allocator<bool>_> local_300;
  assertion_result local_2d8;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  initializer_list<bool> local_2a0;
  allocator<unsigned_int> local_289;
  uint local_288 [8];
  iterator local_268;
  size_type local_260;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  undefined1 local_240 [8];
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  col1;
  size_t local_1f8;
  basic_cstring<const_char> local_1f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1e0;
  basic_cstring<const_char> local_1b8;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_178;
  vector<bool,_std::allocator<bool>_> local_158;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  bool local_f7 [7];
  iterator local_f0;
  undefined8 local_e8;
  allocator<unsigned_int> local_d9;
  uint local_d8 [8];
  iterator local_b8;
  size_type local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  undefined1 local_90 [8];
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  col0;
  Column_z2_settings local_39;
  undefined1 local_38 [7];
  Column_settings settings;
  vector<bool,_std::allocator<bool>_> veccont;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
  *matrix_local;
  
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_38);
  Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>
  ::Column_z2_settings::Column_z2_settings(&local_39);
  local_d8[0] = 0;
  local_d8[1] = 1;
  local_d8[2] = 2;
  local_d8[3] = 5;
  local_d8[4] = 6;
  local_b8 = local_d8;
  local_b0 = 5;
  std::allocator<unsigned_int>::allocator(&local_d9);
  __l_07._M_len = local_b0;
  __l_07._M_array = local_b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_a8,__l_07,&local_d9);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)local_90,&local_a8,&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
  std::allocator<unsigned_int>::~allocator(&local_d9);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::operator+=((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
                *)pvVar3,
               (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                *)local_90);
  local_f7[0] = false;
  local_f7[1] = false;
  local_f7[2] = true;
  local_f7[3] = true;
  local_f7[4] = false;
  local_f7[5] = false;
  local_f7[6] = true;
  local_f0 = local_f7;
  local_e8 = 7;
  __l_06._M_len = 7;
  __l_06._M_array = local_f0;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_38,__l_06);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_108,0x3bf,&local_118);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,0);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_38);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
    ::get_content(&local_158,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_158,(vector<bool,_std::allocator<bool>_> *)local_38);
    boost::test_tools::assertion_result::assertion_result(&local_130,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,"matrix[0].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_178,plVar5,&local_188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_130,&local_178,&local_198,0x3bf,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_178);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_158);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1a8,0x3c1,&local_1b8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1e0,plVar5,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,0);
    local_1f8 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                ::size(pvVar3);
    col1.entryPool_._4_4_ = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_1e0,&local_1f0,0x3c1,1,2,&local_1f8,"matrix[0].size()",
               (undefined1 *)((long)&col1.entryPool_ + 4),"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_288[0] = 0;
  local_288[1] = 1;
  local_288[2] = 2;
  local_288[3] = 5;
  local_288[4] = 6;
  local_268 = local_288;
  local_260 = 5;
  std::allocator<unsigned_int>::allocator(&local_289);
  __l_05._M_len = local_260;
  __l_05._M_array = local_268;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_258,__l_05,&local_289);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)local_240,&local_258,&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_258);
  std::allocator<unsigned_int>::~allocator(&local_289);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::operator+=((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
                *)pvVar3,
               (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                *)local_240);
  std::initializer_list<bool>::initializer_list(&local_2a0);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_38,local_2a0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2b0,0x3c8,&local_2c0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,1);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_38);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
    ::get_content(&local_300,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_300,(vector<bool,_std::allocator<bool>_> *)local_38);
    boost::test_tools::assertion_result::assertion_result(&local_2d8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,"matrix[1].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_320,plVar5,&local_330);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2d8,&local_320,&local_340,0x3c8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_2d8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_300);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_360);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_350,0x3ca,&local_360);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_388,plVar5,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,1);
    local_3a0 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_3a4 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_388,&local_398,0x3ca,1,2,&local_3a0,"matrix[1].size()",&local_3a4,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_388);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,4);
  local_3a5 = true;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)pvVar3,&local_3a5,
             (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_240);
  local_3bf[0] = false;
  local_3bf[1] = false;
  local_3bf[2] = true;
  local_3bf[3] = true;
  local_3bf[4] = false;
  local_3bf[5] = false;
  local_3bf[6] = true;
  local_3b8 = local_3bf;
  local_3b0 = 7;
  __l_04._M_len = 7;
  __l_04._M_array = local_3b8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_38,__l_04);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3d0,0x3d0,&local_3e0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,4);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_38);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
    ::get_content(&local_420,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_420,(vector<bool,_std::allocator<bool>_> *)local_38);
    boost::test_tools::assertion_result::assertion_result(&local_3f8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_450,"matrix[4].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_440,plVar5,&local_450);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3f8,&local_440,&local_460,0x3d0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_440);
    boost::test_tools::assertion_result::~assertion_result(&local_3f8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_420);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_470,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_480);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_470,0x3d2,&local_480);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4a8,plVar5,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,4);
    local_4c0 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                ::size(pvVar3);
    col2.entryPool_._4_4_ = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_4a8,&local_4b8,0x3d2,1,2,&local_4c0,"matrix[4].size()",
               (undefined1 *)((long)&col2.entryPool_ + 4),"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_528.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_528);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)local_508,&local_528,&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_528);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,5);
  local_529 = true;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::
  multiply_source_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)pvVar3,
             (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_508,&local_529);
  local_547[0] = true;
  local_547[1] = true;
  local_547[2] = true;
  local_547[3] = false;
  local_547[4] = false;
  local_547[5] = true;
  local_547[6] = true;
  local_540 = local_547;
  local_538 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_540;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_38,__l_03);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_568);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_558,0x3d8,&local_568);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_38);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
    ::get_content(&local_5a8,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_5a8,(vector<bool,_std::allocator<bool>_> *)local_38);
    boost::test_tools::assertion_result::assertion_result(&local_580,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_5c8,plVar5,&local_5d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_580,&local_5c8,&local_5e8,0x3d8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5c8);
    boost::test_tools::assertion_result::~assertion_result(&local_580);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_5a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_608);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5f8,0x3da,&local_608);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_630,plVar5,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_640,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    local_648 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                ::size(pvVar3);
    col3.entryPool_._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_630,&local_640,0x3da,1,2,&local_648,"matrix[5].size()",
               (undefined1 *)((long)&col3.entryPool_ + 4),"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_630);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_6c4[0] = 2;
  local_6c4[1] = 3;
  local_6c4[2] = 6;
  local_6b8 = local_6c4;
  local_6b0 = 3;
  std::allocator<unsigned_int>::allocator(&local_6c5);
  __l_02._M_len = local_6b0;
  __l_02._M_array = local_6b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_6a8,__l_02,&local_6c5);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)local_690,&local_6a8,&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6a8);
  std::allocator<unsigned_int>::~allocator(&local_6c5);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,5);
  local_6c6 = true;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::
  multiply_source_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)pvVar3,
             (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_690,&local_6c6);
  local_6df[0] = true;
  local_6df[1] = true;
  local_6df[2] = false;
  local_6df[3] = true;
  local_6df[4] = false;
  local_6df[5] = true;
  local_6df[6] = false;
  local_6d8 = local_6df;
  local_6d0 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_6d8;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_38,__l_01);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_700);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6f0,0x3e0,&local_700);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_38);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
    ::get_content(&local_740,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_740,(vector<bool,_std::allocator<bool>_> *)local_38);
    boost::test_tools::assertion_result::assertion_result(&local_718,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_770,"matrix[5].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_760,plVar5,&local_770);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_780,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_718,&local_760,&local_780,0x3e0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_760);
    boost::test_tools::assertion_result::~assertion_result(&local_718);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_740);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_790,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_790,0x3e2,&local_7a0);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_7c8,plVar5,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,5);
    local_7e0 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                ::size(pvVar3);
    col4.entryPool_._4_4_ = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_7c8,&local_7d8,0x3e2,1,2,&local_7e0,"matrix[5].size()",
               (undefined1 *)((long)&col4.entryPool_ + 4),"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_7c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_860[0] = 0;
  local_860[1] = 1;
  local_860[2] = 3;
  local_860[3] = 5;
  local_850 = local_860;
  local_848 = 4;
  std::allocator<unsigned_int>::allocator(&local_861);
  __l_00._M_len = local_848;
  __l_00._M_array = local_850;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_840,__l_00,&local_861);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)local_828,&local_840,&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_840);
  std::allocator<unsigned_int>::~allocator(&local_861);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
           ::operator[](matrix,3);
  local_862 = true;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>>
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,false>>>*>>>
              *)pvVar3,&local_862,
             (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_828);
  local_87f[0] = true;
  local_87f[1] = true;
  local_87f[2] = false;
  local_87f[3] = true;
  local_87f[4] = false;
  local_87f[5] = true;
  local_87f[6] = false;
  local_878 = local_87f;
  local_870 = 7;
  __l._M_len = 7;
  __l._M_array = local_878;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_38,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_890,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_890,1000,&local_8a0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,3);
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_38);
    Gudhi::persistence_matrix::
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
    ::get_content(&local_8e0,pvVar3,(int)sVar4);
    bVar2 = std::operator==(&local_8e0,(vector<bool,_std::allocator<bool>_> *)local_38);
    boost::test_tools::assertion_result::assertion_result(&local_8b8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_910,"matrix[3].get_content(veccont.size()) == veccont",0x30);
    boost::unit_test::operator<<(&local_900,plVar5,&local_910);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_920,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_8b8,&local_900,&local_920,1000,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_900);
    boost::test_tools::assertion_result::~assertion_result(&local_8b8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_8e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_930,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_940);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_930,0x3ea,&local_940);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_968,plVar5,(char (*) [1])0x29b16e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_978,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>_>_>
             ::operator[](matrix,3);
    local_980 = Gudhi::persistence_matrix::
                Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
                ::size(pvVar3);
    local_984 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_968,&local_978,0x3ea,1,2,&local_980,"matrix[3].size()",&local_984,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_968);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_828);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_690);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_508);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_240);
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
  ::~Naive_vector_column
            ((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_false>_>_>_*>_>_>
              *)local_90);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_38)
  ;
  return;
}

Assistant:

void column_test_boundary_z2_operators(std::vector<Column>& matrix) {
  using cont = std::vector<unsigned int>;

  std::vector<bool> veccont;
  typename Column::Column_settings settings;

  const Column col0(cont{0, 1, 2, 5, 6}, &settings);
  matrix[0] += col0;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  const Column col1(cont{0, 1, 2, 5, 6}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, col1);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  const Column col3(cont{2, 3, 6}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  const Column col4(cont{0, 1, 3, 5}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}